

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_ec_point_add_extension(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  CBB formats;
  CBB contents;
  
  iVar1 = CBB_add_u16((CBB *)hs,0xb);
  if (((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed((CBB *)hs,&contents), iVar1 != 0)) &&
     (iVar1 = CBB_add_u8_length_prefixed(&contents,&formats), iVar1 != 0)) {
    iVar1 = CBB_add_u8(&formats,'\0');
    if (iVar1 == 0) {
      return false;
    }
    iVar1 = CBB_flush((CBB *)hs);
    return iVar1 != 0;
  }
  return false;
}

Assistant:

static bool ext_ec_point_add_extension(const SSL_HANDSHAKE *hs, CBB *out) {
  CBB contents, formats;
  if (!CBB_add_u16(out, TLSEXT_TYPE_ec_point_formats) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u8_length_prefixed(&contents, &formats) ||
      !CBB_add_u8(&formats, TLSEXT_ECPOINTFORMAT_uncompressed) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}